

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpWithTcpServer::removeConnectionInLoop(KcpWithTcpServer *this,TcpConnectionPtr *conn)

{
  LogLevel LVar1;
  uint32_t v;
  LogStream *this_00;
  self *psVar2;
  element_type *peVar3;
  string *v_00;
  EventLoop *f;
  KcpTcpEventLoop *this_01;
  SourceFile file;
  code *local_1078;
  undefined8 local_1070;
  type local_1068;
  Functor local_1040;
  KcpTcpEventLoop *local_1020;
  KcpTcpEventLoop *ioLoop;
  size_type local_1010;
  size_t n;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18
  ;
  TcpConnectionPtr *conn_local;
  KcpWithTcpServer *this_local;
  
  local_18 = (__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)conn;
  conn_local = (TcpConnectionPtr *)this;
  EventLoop::assertInLoopThread(&this->m_loop->super_EventLoop);
  LVar1 = Logger::logLevel();
  if ((int)LVar1 < 3) {
    Logger::SourceFile::SourceFile<107>
              ((SourceFile *)local_ff8,
               (char (*) [107])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    Logger::Logger(&local_fe8,file,0x5f);
    this_00 = Logger::stream(&local_fe8);
    psVar2 = LogStream::operator<<(this_00,"KcpWithTcpServer::removeConnectionInLoop [");
    psVar2 = LogStream::operator<<(psVar2,&this->m_name);
    psVar2 = LogStream::operator<<(psVar2,"] - connection ");
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    v_00 = TcpConnection::name_abi_cxx11_(peVar3);
    psVar2 = LogStream::operator<<(psVar2,v_00);
    psVar2 = LogStream::operator<<(psVar2," - ");
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    v = TcpConnection::id(peVar3);
    LogStream::operator<<(psVar2,v);
    Logger::~Logger(&local_fe8);
  }
  peVar3 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  ioLoop._4_4_ = TcpConnection::id(peVar3);
  local_1010 = std::
               map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
               ::erase(&this->m_connections,(key_type *)((long)&ioLoop + 4));
  if (local_1010 == 1) {
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    f = TcpConnection::getLoop(peVar3);
    this_01 = down_cast<sznet::net::KcpTcpEventLoop*,sznet::net::EventLoop>(f);
    local_1078 = KcpTcpEventLoop::removeTcpConnectionInLoop;
    local_1070 = 0;
    local_1020 = this_01;
    std::
    bind<void(sznet::net::KcpTcpEventLoop::*)(std::shared_ptr<sznet::net::TcpConnection>const&),sznet::net::KcpTcpEventLoop*&,std::shared_ptr<sznet::net::TcpConnection>const&>
              (&local_1068,(offset_in_KcpTcpEventLoop_to_subr *)&local_1078,&local_1020,
               (shared_ptr<sznet::net::TcpConnection> *)local_18);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
              ((function<void()> *)&local_1040,&local_1068);
    EventLoop::queueInLoop(&this_01->super_EventLoop,&local_1040);
    std::function<void_()>::~function(&local_1040);
    std::
    _Bind<void_(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
    ::~_Bind(&local_1068);
    return;
  }
  __assert_fail("n == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
                ,99,
                "void sznet::net::KcpWithTcpServer::removeConnectionInLoop(const TcpConnectionPtr &)"
               );
}

Assistant:

void KcpWithTcpServer::removeConnectionInLoop(const TcpConnectionPtr& conn)
{
	m_loop->assertInLoopThread();
	LOG_INFO << "KcpWithTcpServer::removeConnectionInLoop [" << m_name
		<< "] - connection " << conn->name() << " - " << conn->id();
	size_t n = m_connections.erase(conn->id());
	(void)n;
	assert(n == 1);
	KcpTcpEventLoop* ioLoop = down_cast<KcpTcpEventLoop*>(conn->getLoop());
	ioLoop->queueInLoop(std::bind(&KcpTcpEventLoop::removeTcpConnectionInLoop, ioLoop, conn));
}